

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bspline_patch.h
# Opt level: O2

void __thiscall
embree::BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
          (BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *this,vboolf_impl<4> *valid,
          vfloat_impl<4> *uu,vfloat_impl<4> *vv,float *P,float *dPdu,float *dPdv,float *ddPdudu,
          float *ddPdvdv,float *ddPdudv,float dscale,size_t dstride,size_t N)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  
  if (P != (float *)0x0) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar22 = 1.0 - fVar42;
    fVar24 = 1.0 - fVar44;
    fVar26 = 1.0 - fVar46;
    fVar28 = 1.0 - fVar48;
    fVar30 = fVar22 * fVar22 * fVar22;
    fVar31 = fVar24 * fVar24 * fVar24;
    fVar32 = fVar26 * fVar26 * fVar26;
    fVar33 = fVar28 * fVar28 * fVar28;
    fVar34 = fVar42 * fVar42 * fVar42;
    fVar35 = fVar44 * fVar44 * fVar44;
    fVar36 = fVar46 * fVar46 * fVar46;
    fVar37 = fVar48 * fVar48 * fVar48;
    fVar23 = fVar22 * fVar42 * fVar22;
    fVar25 = fVar24 * fVar44 * fVar24;
    fVar27 = fVar26 * fVar46 * fVar26;
    fVar29 = fVar28 * fVar48 * fVar28;
    fVar42 = fVar42 * fVar22 * fVar42;
    fVar44 = fVar44 * fVar24 * fVar44;
    fVar46 = fVar46 * fVar26 * fVar46;
    fVar48 = fVar48 * fVar28 * fVar48;
    fVar22 = (vv->field_0).v[0];
    fVar24 = (vv->field_0).v[1];
    fVar26 = (vv->field_0).v[2];
    fVar28 = (vv->field_0).v[3];
    fVar14 = 1.0 - fVar22;
    fVar16 = 1.0 - fVar24;
    fVar18 = 1.0 - fVar26;
    fVar20 = 1.0 - fVar28;
    fVar38 = fVar14 * fVar14 * fVar14;
    fVar39 = fVar16 * fVar16 * fVar16;
    fVar40 = fVar18 * fVar18 * fVar18;
    fVar41 = fVar20 * fVar20 * fVar20;
    fVar43 = fVar22 * fVar22 * fVar22;
    fVar45 = fVar24 * fVar24 * fVar24;
    fVar47 = fVar26 * fVar26 * fVar26;
    fVar49 = fVar28 * fVar28 * fVar28;
    fVar15 = fVar14 * fVar22 * fVar14;
    fVar17 = fVar16 * fVar24 * fVar16;
    fVar19 = fVar18 * fVar26 * fVar18;
    fVar21 = fVar20 * fVar28 * fVar20;
    fVar22 = fVar22 * fVar14 * fVar22;
    fVar24 = fVar24 * fVar16 * fVar24;
    fVar26 = fVar26 * fVar18 * fVar26;
    fVar28 = fVar28 * fVar20 * fVar28;
    fVar14 = fVar38 * 0.16666667;
    fVar16 = fVar39 * 0.16666667;
    fVar18 = fVar40 * 0.16666667;
    fVar20 = fVar41 * 0.16666667;
    fVar50 = (fVar22 * 6.0 + fVar15 * 12.0 + fVar38 * 4.0 + fVar43) * 0.16666667;
    fVar51 = (fVar24 * 6.0 + fVar17 * 12.0 + fVar39 * 4.0 + fVar45) * 0.16666667;
    fVar52 = (fVar26 * 6.0 + fVar19 * 12.0 + fVar40 * 4.0 + fVar47) * 0.16666667;
    fVar53 = (fVar28 * 6.0 + fVar21 * 12.0 + fVar41 * 4.0 + fVar49) * 0.16666667;
    fVar22 = (fVar15 * 6.0 + fVar22 * 12.0 + fVar43 * 4.0 + fVar38) * 0.16666667;
    fVar24 = (fVar17 * 6.0 + fVar24 * 12.0 + fVar45 * 4.0 + fVar39) * 0.16666667;
    fVar26 = (fVar19 * 6.0 + fVar26 * 12.0 + fVar47 * 4.0 + fVar40) * 0.16666667;
    fVar28 = (fVar21 * 6.0 + fVar28 * 12.0 + fVar49 * 4.0 + fVar41) * 0.16666667;
    fVar43 = fVar43 * 0.16666667;
    fVar45 = fVar45 * 0.16666667;
    fVar47 = fVar47 * 0.16666667;
    fVar49 = fVar49 * 0.16666667;
    for (sVar13 = 0; N != sVar13; sVar13 = sVar13 + 1) {
      fVar15 = *(float *)(this + sVar13 * 4);
      fVar17 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar19 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar21 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar38 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar39 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar40 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar41 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar1 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar2 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar3 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar4 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar5 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar6 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar7 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar8 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *P = (float)(~(valid->field_0).i[0] & (uint)*P |
                  (uint)((fVar21 * fVar14 + fVar6 * fVar50 + fVar7 * fVar22 + fVar8 * fVar43) *
                         fVar34 * 0.16666667 +
                         (fVar19 * fVar14 + fVar3 * fVar50 + fVar4 * fVar22 + fVar5 * fVar43) *
                         (fVar23 * 6.0 + fVar42 * 12.0 + fVar34 * 4.0 + fVar30) * 0.16666667 +
                         (fVar17 * fVar14 + fVar41 * fVar50 + fVar1 * fVar22 + fVar2 * fVar43) *
                         (fVar42 * 6.0 + fVar23 * 12.0 + fVar30 * 4.0 + fVar34) * 0.16666667 +
                        (fVar15 * fVar14 + fVar38 * fVar50 + fVar39 * fVar22 + fVar40 * fVar43) *
                        fVar30 * 0.16666667) & (valid->field_0).i[0]);
      P[1] = (float)(~uVar10 & (uint)P[1] |
                    (uint)((fVar21 * fVar16 + fVar6 * fVar51 + fVar7 * fVar24 + fVar8 * fVar45) *
                           fVar35 * 0.16666667 +
                           (fVar19 * fVar16 + fVar3 * fVar51 + fVar4 * fVar24 + fVar5 * fVar45) *
                           (fVar25 * 6.0 + fVar44 * 12.0 + fVar35 * 4.0 + fVar31) * 0.16666667 +
                           (fVar17 * fVar16 + fVar41 * fVar51 + fVar1 * fVar24 + fVar2 * fVar45) *
                           (fVar44 * 6.0 + fVar25 * 12.0 + fVar31 * 4.0 + fVar35) * 0.16666667 +
                          (fVar15 * fVar16 + fVar38 * fVar51 + fVar39 * fVar24 + fVar40 * fVar45) *
                          fVar31 * 0.16666667) & uVar10);
      P[2] = (float)(~uVar11 & (uint)P[2] |
                    (uint)((fVar21 * fVar18 + fVar6 * fVar52 + fVar7 * fVar26 + fVar8 * fVar47) *
                           fVar36 * 0.16666667 +
                           (fVar19 * fVar18 + fVar3 * fVar52 + fVar4 * fVar26 + fVar5 * fVar47) *
                           (fVar27 * 6.0 + fVar46 * 12.0 + fVar36 * 4.0 + fVar32) * 0.16666667 +
                           (fVar17 * fVar18 + fVar41 * fVar52 + fVar1 * fVar26 + fVar2 * fVar47) *
                           (fVar46 * 6.0 + fVar27 * 12.0 + fVar32 * 4.0 + fVar36) * 0.16666667 +
                          (fVar15 * fVar18 + fVar38 * fVar52 + fVar39 * fVar26 + fVar40 * fVar47) *
                          fVar32 * 0.16666667) & uVar11);
      P[3] = (float)(~uVar12 & (uint)P[3] |
                    (uint)((fVar21 * fVar20 + fVar6 * fVar53 + fVar7 * fVar28 + fVar8 * fVar49) *
                           fVar37 * 0.16666667 +
                           (fVar19 * fVar20 + fVar3 * fVar53 + fVar4 * fVar28 + fVar5 * fVar49) *
                           (fVar29 * 6.0 + fVar48 * 12.0 + fVar37 * 4.0 + fVar33) * 0.16666667 +
                           (fVar17 * fVar20 + fVar41 * fVar53 + fVar1 * fVar28 + fVar2 * fVar49) *
                           (fVar48 * 6.0 + fVar29 * 12.0 + fVar33 * 4.0 + fVar37) * 0.16666667 +
                          (fVar15 * fVar20 + fVar38 * fVar53 + fVar39 * fVar28 + fVar40 * fVar49) *
                          fVar33 * 0.16666667) & uVar12);
      P = P + dstride;
    }
  }
  if (dPdu != (float *)0x0) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar18 = 1.0 - fVar42;
    fVar19 = 1.0 - fVar44;
    fVar20 = 1.0 - fVar46;
    fVar21 = 1.0 - fVar48;
    fVar14 = fVar42 * fVar18 * 4.0;
    fVar15 = fVar44 * fVar19 * 4.0;
    fVar16 = fVar46 * fVar20 * 4.0;
    fVar17 = fVar48 * fVar21 * 4.0;
    fVar22 = (vv->field_0).v[0];
    fVar24 = (vv->field_0).v[1];
    fVar26 = (vv->field_0).v[2];
    fVar28 = (vv->field_0).v[3];
    fVar23 = 1.0 - fVar22;
    fVar25 = 1.0 - fVar24;
    fVar27 = 1.0 - fVar26;
    fVar29 = 1.0 - fVar28;
    fVar34 = fVar23 * fVar23 * fVar23;
    fVar36 = fVar25 * fVar25 * fVar25;
    fVar38 = fVar27 * fVar27 * fVar27;
    fVar40 = fVar29 * fVar29 * fVar29;
    fVar43 = fVar22 * fVar22 * fVar22;
    fVar45 = fVar24 * fVar24 * fVar24;
    fVar47 = fVar26 * fVar26 * fVar26;
    fVar49 = fVar28 * fVar28 * fVar28;
    fVar30 = fVar23 * fVar22 * fVar23;
    fVar31 = fVar25 * fVar24 * fVar25;
    fVar32 = fVar27 * fVar26 * fVar27;
    fVar33 = fVar29 * fVar28 * fVar29;
    fVar22 = fVar22 * fVar23 * fVar22;
    fVar24 = fVar24 * fVar25 * fVar24;
    fVar26 = fVar26 * fVar27 * fVar26;
    fVar28 = fVar28 * fVar29 * fVar28;
    fVar35 = fVar34 * 0.16666667;
    fVar37 = fVar36 * 0.16666667;
    fVar39 = fVar38 * 0.16666667;
    fVar41 = fVar40 * 0.16666667;
    fVar23 = (fVar22 * 6.0 + fVar30 * 12.0 + fVar34 * 4.0 + fVar43) * 0.16666667;
    fVar25 = (fVar24 * 6.0 + fVar31 * 12.0 + fVar36 * 4.0 + fVar45) * 0.16666667;
    fVar27 = (fVar26 * 6.0 + fVar32 * 12.0 + fVar38 * 4.0 + fVar47) * 0.16666667;
    fVar29 = (fVar28 * 6.0 + fVar33 * 12.0 + fVar40 * 4.0 + fVar49) * 0.16666667;
    fVar22 = (fVar30 * 6.0 + fVar22 * 12.0 + fVar43 * 4.0 + fVar34) * 0.16666667;
    fVar24 = (fVar31 * 6.0 + fVar24 * 12.0 + fVar45 * 4.0 + fVar36) * 0.16666667;
    fVar26 = (fVar32 * 6.0 + fVar26 * 12.0 + fVar47 * 4.0 + fVar38) * 0.16666667;
    fVar28 = (fVar33 * 6.0 + fVar28 * 12.0 + fVar49 * 4.0 + fVar40) * 0.16666667;
    fVar43 = fVar43 * 0.16666667;
    fVar45 = fVar45 * 0.16666667;
    fVar47 = fVar47 * 0.16666667;
    fVar49 = fVar49 * 0.16666667;
    for (sVar13 = 0; N != sVar13; sVar13 = sVar13 + 1) {
      fVar30 = *(float *)(this + sVar13 * 4);
      fVar31 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar32 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar33 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar34 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar36 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar38 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar40 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar50 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar51 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar52 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar53 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar1 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar2 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar3 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar4 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *dPdu = (float)(~(valid->field_0).i[0] & (uint)*dPdu |
                     (uint)(((fVar33 * fVar35 + fVar2 * fVar23 + fVar3 * fVar22 + fVar4 * fVar43) *
                             fVar42 * fVar42 * 0.5 +
                             (fVar32 * fVar35 + fVar52 * fVar23 + fVar53 * fVar22 + fVar1 * fVar43)
                             * (fVar18 * fVar18 + fVar14) * 0.5 +
                             (fVar31 * fVar35 + fVar40 * fVar23 + fVar50 * fVar22 + fVar51 * fVar43)
                             * (-fVar42 * fVar42 - fVar14) * 0.5 +
                            (fVar30 * fVar35 + fVar34 * fVar23 + fVar36 * fVar22 + fVar38 * fVar43)
                            * -fVar18 * fVar18 * 0.5) * dscale) & (valid->field_0).i[0]);
      dPdu[1] = (float)(~uVar10 & (uint)dPdu[1] |
                       (uint)(((fVar33 * fVar37 + fVar2 * fVar25 + fVar3 * fVar24 + fVar4 * fVar45)
                               * fVar44 * fVar44 * 0.5 +
                               (fVar32 * fVar37 + fVar52 * fVar25 + fVar53 * fVar24 + fVar1 * fVar45
                               ) * (fVar19 * fVar19 + fVar15) * 0.5 +
                               (fVar31 * fVar37 +
                               fVar40 * fVar25 + fVar50 * fVar24 + fVar51 * fVar45) *
                               (-fVar44 * fVar44 - fVar15) * 0.5 +
                              (fVar30 * fVar37 + fVar34 * fVar25 + fVar36 * fVar24 + fVar38 * fVar45
                              ) * -fVar19 * fVar19 * 0.5) * dscale) & uVar10);
      dPdu[2] = (float)(~uVar11 & (uint)dPdu[2] |
                       (uint)(((fVar33 * fVar39 + fVar2 * fVar27 + fVar3 * fVar26 + fVar4 * fVar47)
                               * fVar46 * fVar46 * 0.5 +
                               (fVar32 * fVar39 + fVar52 * fVar27 + fVar53 * fVar26 + fVar1 * fVar47
                               ) * (fVar20 * fVar20 + fVar16) * 0.5 +
                               (fVar31 * fVar39 +
                               fVar40 * fVar27 + fVar50 * fVar26 + fVar51 * fVar47) *
                               (-fVar46 * fVar46 - fVar16) * 0.5 +
                              (fVar30 * fVar39 + fVar34 * fVar27 + fVar36 * fVar26 + fVar38 * fVar47
                              ) * -fVar20 * fVar20 * 0.5) * dscale) & uVar11);
      dPdu[3] = (float)(~uVar12 & (uint)dPdu[3] |
                       (uint)(((fVar33 * fVar41 + fVar2 * fVar29 + fVar3 * fVar28 + fVar4 * fVar49)
                               * fVar48 * fVar48 * 0.5 +
                               (fVar32 * fVar41 + fVar52 * fVar29 + fVar53 * fVar28 + fVar1 * fVar49
                               ) * (fVar21 * fVar21 + fVar17) * 0.5 +
                               (fVar31 * fVar41 +
                               fVar40 * fVar29 + fVar50 * fVar28 + fVar51 * fVar49) *
                               (-fVar48 * fVar48 - fVar17) * 0.5 +
                              (fVar30 * fVar41 + fVar34 * fVar29 + fVar36 * fVar28 + fVar38 * fVar49
                              ) * -fVar21 * fVar21 * 0.5) * dscale) & uVar12);
      dPdu = dPdu + dstride;
    }
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar22 = 1.0 - fVar42;
    fVar24 = 1.0 - fVar44;
    fVar26 = 1.0 - fVar46;
    fVar28 = 1.0 - fVar48;
    fVar34 = fVar22 * fVar22 * fVar22;
    fVar35 = fVar24 * fVar24 * fVar24;
    fVar36 = fVar26 * fVar26 * fVar26;
    fVar37 = fVar28 * fVar28 * fVar28;
    fVar38 = fVar42 * fVar42 * fVar42;
    fVar39 = fVar44 * fVar44 * fVar44;
    fVar40 = fVar46 * fVar46 * fVar46;
    fVar41 = fVar48 * fVar48 * fVar48;
    fVar30 = fVar22 * fVar42 * fVar22;
    fVar31 = fVar24 * fVar44 * fVar24;
    fVar32 = fVar26 * fVar46 * fVar26;
    fVar33 = fVar28 * fVar48 * fVar28;
    fVar42 = fVar42 * fVar22 * fVar42;
    fVar44 = fVar44 * fVar24 * fVar44;
    fVar46 = fVar46 * fVar26 * fVar46;
    fVar48 = fVar48 * fVar28 * fVar48;
    fVar22 = (vv->field_0).v[0];
    fVar24 = (vv->field_0).v[1];
    fVar26 = (vv->field_0).v[2];
    fVar28 = (vv->field_0).v[3];
    fVar14 = 1.0 - fVar22;
    fVar15 = 1.0 - fVar24;
    fVar16 = 1.0 - fVar26;
    fVar17 = 1.0 - fVar28;
    fVar23 = fVar22 * fVar14 * 4.0;
    fVar25 = fVar24 * fVar15 * 4.0;
    fVar27 = fVar26 * fVar16 * 4.0;
    fVar29 = fVar28 * fVar17 * 4.0;
    fVar43 = -fVar14 * fVar14 * 0.5;
    fVar45 = -fVar15 * fVar15 * 0.5;
    fVar47 = -fVar16 * fVar16 * 0.5;
    fVar49 = -fVar17 * fVar17 * 0.5;
    fVar18 = (-fVar22 * fVar22 - fVar23) * 0.5;
    fVar19 = (-fVar24 * fVar24 - fVar25) * 0.5;
    fVar20 = (-fVar26 * fVar26 - fVar27) * 0.5;
    fVar21 = (-fVar28 * fVar28 - fVar29) * 0.5;
    fVar14 = (fVar14 * fVar14 + fVar23) * 0.5;
    fVar15 = (fVar15 * fVar15 + fVar25) * 0.5;
    fVar16 = (fVar16 * fVar16 + fVar27) * 0.5;
    fVar17 = (fVar17 * fVar17 + fVar29) * 0.5;
    fVar22 = fVar22 * fVar22 * 0.5;
    fVar24 = fVar24 * fVar24 * 0.5;
    fVar26 = fVar26 * fVar26 * 0.5;
    fVar28 = fVar28 * fVar28 * 0.5;
    for (sVar13 = 0; N != sVar13; sVar13 = sVar13 + 1) {
      fVar23 = *(float *)(this + sVar13 * 4);
      fVar25 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar27 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar29 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar50 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar51 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar52 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar53 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar1 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar2 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar3 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar4 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar5 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar6 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar7 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar8 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *dPdv = (float)(~(valid->field_0).i[0] & (uint)*dPdv |
                     (uint)(((fVar29 * fVar43 + fVar6 * fVar18 + fVar7 * fVar14 + fVar8 * fVar22) *
                             fVar38 * 0.16666667 +
                             (fVar27 * fVar43 + fVar3 * fVar18 + fVar4 * fVar14 + fVar5 * fVar22) *
                             (fVar30 * 6.0 + fVar42 * 12.0 + fVar38 * 4.0 + fVar34) * 0.16666667 +
                             (fVar25 * fVar43 + fVar53 * fVar18 + fVar1 * fVar14 + fVar2 * fVar22) *
                             (fVar42 * 6.0 + fVar30 * 12.0 + fVar34 * 4.0 + fVar38) * 0.16666667 +
                            (fVar23 * fVar43 + fVar50 * fVar18 + fVar51 * fVar14 + fVar52 * fVar22)
                            * fVar34 * 0.16666667) * dscale) & (valid->field_0).i[0]);
      dPdv[1] = (float)(~uVar10 & (uint)dPdv[1] |
                       (uint)(((fVar29 * fVar45 + fVar6 * fVar19 + fVar7 * fVar15 + fVar8 * fVar24)
                               * fVar39 * 0.16666667 +
                               (fVar27 * fVar45 + fVar3 * fVar19 + fVar4 * fVar15 + fVar5 * fVar24)
                               * (fVar31 * 6.0 + fVar44 * 12.0 + fVar39 * 4.0 + fVar35) * 0.16666667
                               + (fVar25 * fVar45 +
                                 fVar53 * fVar19 + fVar1 * fVar15 + fVar2 * fVar24) *
                                 (fVar44 * 6.0 + fVar31 * 12.0 + fVar35 * 4.0 + fVar39) * 0.16666667
                              + (fVar23 * fVar45 +
                                fVar50 * fVar19 + fVar51 * fVar15 + fVar52 * fVar24) *
                                fVar35 * 0.16666667) * dscale) & uVar10);
      dPdv[2] = (float)(~uVar11 & (uint)dPdv[2] |
                       (uint)(((fVar29 * fVar47 + fVar6 * fVar20 + fVar7 * fVar16 + fVar8 * fVar26)
                               * fVar40 * 0.16666667 +
                               (fVar27 * fVar47 + fVar3 * fVar20 + fVar4 * fVar16 + fVar5 * fVar26)
                               * (fVar32 * 6.0 + fVar46 * 12.0 + fVar40 * 4.0 + fVar36) * 0.16666667
                               + (fVar25 * fVar47 +
                                 fVar53 * fVar20 + fVar1 * fVar16 + fVar2 * fVar26) *
                                 (fVar46 * 6.0 + fVar32 * 12.0 + fVar36 * 4.0 + fVar40) * 0.16666667
                              + (fVar23 * fVar47 +
                                fVar50 * fVar20 + fVar51 * fVar16 + fVar52 * fVar26) *
                                fVar36 * 0.16666667) * dscale) & uVar11);
      dPdv[3] = (float)(~uVar12 & (uint)dPdv[3] |
                       (uint)(((fVar29 * fVar49 + fVar6 * fVar21 + fVar7 * fVar17 + fVar8 * fVar28)
                               * fVar41 * 0.16666667 +
                               (fVar27 * fVar49 + fVar3 * fVar21 + fVar4 * fVar17 + fVar5 * fVar28)
                               * (fVar33 * 6.0 + fVar48 * 12.0 + fVar41 * 4.0 + fVar37) * 0.16666667
                               + (fVar25 * fVar49 +
                                 fVar53 * fVar21 + fVar1 * fVar17 + fVar2 * fVar28) *
                                 (fVar48 * 6.0 + fVar33 * 12.0 + fVar37 * 4.0 + fVar41) * 0.16666667
                              + (fVar23 * fVar49 +
                                fVar50 * fVar21 + fVar51 * fVar17 + fVar52 * fVar28) *
                                fVar37 * 0.16666667) * dscale) & uVar12);
      dPdv = dPdv + dstride;
    }
  }
  if (ddPdudu != (float *)0x0) {
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar14 = 1.0 - fVar42;
    fVar15 = 1.0 - fVar44;
    fVar16 = 1.0 - fVar46;
    fVar17 = 1.0 - fVar48;
    fVar22 = (vv->field_0).v[0];
    fVar24 = (vv->field_0).v[1];
    fVar26 = (vv->field_0).v[2];
    fVar28 = (vv->field_0).v[3];
    fVar18 = 1.0 - fVar22;
    fVar20 = 1.0 - fVar24;
    fVar23 = 1.0 - fVar26;
    fVar27 = 1.0 - fVar28;
    fVar30 = fVar18 * fVar18 * fVar18;
    fVar31 = fVar20 * fVar20 * fVar20;
    fVar32 = fVar23 * fVar23 * fVar23;
    fVar33 = fVar27 * fVar27 * fVar27;
    fVar35 = fVar22 * fVar22 * fVar22;
    fVar36 = fVar24 * fVar24 * fVar24;
    fVar37 = fVar26 * fVar26 * fVar26;
    fVar38 = fVar28 * fVar28 * fVar28;
    fVar19 = fVar18 * fVar22 * fVar18;
    fVar21 = fVar20 * fVar24 * fVar20;
    fVar25 = fVar23 * fVar26 * fVar23;
    fVar29 = fVar27 * fVar28 * fVar27;
    fVar22 = fVar22 * fVar18 * fVar22;
    fVar24 = fVar24 * fVar20 * fVar24;
    fVar26 = fVar26 * fVar23 * fVar26;
    fVar28 = fVar28 * fVar27 * fVar28;
    fVar20 = fVar30 * 0.16666667;
    fVar23 = fVar31 * 0.16666667;
    fVar27 = fVar32 * 0.16666667;
    fVar34 = fVar33 * 0.16666667;
    fVar39 = (fVar22 * 6.0 + fVar19 * 12.0 + fVar30 * 4.0 + fVar35) * 0.16666667;
    fVar40 = (fVar24 * 6.0 + fVar21 * 12.0 + fVar31 * 4.0 + fVar36) * 0.16666667;
    fVar41 = (fVar26 * 6.0 + fVar25 * 12.0 + fVar32 * 4.0 + fVar37) * 0.16666667;
    fVar43 = (fVar28 * 6.0 + fVar29 * 12.0 + fVar33 * 4.0 + fVar38) * 0.16666667;
    fVar18 = (fVar19 * 6.0 + fVar22 * 12.0 + fVar35 * 4.0 + fVar30) * 0.16666667;
    fVar24 = (fVar21 * 6.0 + fVar24 * 12.0 + fVar36 * 4.0 + fVar31) * 0.16666667;
    fVar26 = (fVar25 * 6.0 + fVar26 * 12.0 + fVar37 * 4.0 + fVar32) * 0.16666667;
    fVar28 = (fVar29 * 6.0 + fVar28 * 12.0 + fVar38 * 4.0 + fVar33) * 0.16666667;
    fVar35 = fVar35 * 0.16666667;
    fVar36 = fVar36 * 0.16666667;
    fVar37 = fVar37 * 0.16666667;
    fVar38 = fVar38 * 0.16666667;
    fVar22 = dscale * dscale;
    for (sVar13 = 0; N != sVar13; sVar13 = sVar13 + 1) {
      fVar19 = *(float *)(this + sVar13 * 4);
      fVar21 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar25 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar29 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar30 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar31 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar32 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar33 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar45 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar47 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar49 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar50 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar51 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar52 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar53 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar1 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *ddPdudu = (float)(~(valid->field_0).i[0] & (uint)*ddPdudu |
                        (uint)(((fVar19 * fVar20 +
                                fVar30 * fVar39 + fVar31 * fVar18 + fVar32 * fVar35) * fVar14 +
                               (fVar29 * fVar20 + fVar52 * fVar39 + fVar53 * fVar18 + fVar1 * fVar35
                               ) * fVar42 +
                               (fVar25 * fVar20 +
                               fVar49 * fVar39 + fVar50 * fVar18 + fVar51 * fVar35) *
                               (fVar14 - (fVar42 + fVar42)) +
                               (fVar21 * fVar20 +
                               fVar33 * fVar39 + fVar45 * fVar18 + fVar47 * fVar35) *
                               (fVar42 - (fVar14 + fVar14))) * fVar22) & (valid->field_0).i[0]);
      ddPdudu[1] = (float)(~uVar10 & (uint)ddPdudu[1] |
                          (uint)(((fVar19 * fVar23 +
                                  fVar30 * fVar40 + fVar31 * fVar24 + fVar32 * fVar36) * fVar15 +
                                 (fVar29 * fVar23 +
                                 fVar52 * fVar40 + fVar53 * fVar24 + fVar1 * fVar36) * fVar44 +
                                 (fVar25 * fVar23 +
                                 fVar49 * fVar40 + fVar50 * fVar24 + fVar51 * fVar36) *
                                 (fVar15 - (fVar44 + fVar44)) +
                                 (fVar21 * fVar23 +
                                 fVar33 * fVar40 + fVar45 * fVar24 + fVar47 * fVar36) *
                                 (fVar44 - (fVar15 + fVar15))) * fVar22) & uVar10);
      ddPdudu[2] = (float)(~uVar11 & (uint)ddPdudu[2] |
                          (uint)(((fVar19 * fVar27 +
                                  fVar30 * fVar41 + fVar31 * fVar26 + fVar32 * fVar37) * fVar16 +
                                 (fVar29 * fVar27 +
                                 fVar52 * fVar41 + fVar53 * fVar26 + fVar1 * fVar37) * fVar46 +
                                 (fVar25 * fVar27 +
                                 fVar49 * fVar41 + fVar50 * fVar26 + fVar51 * fVar37) *
                                 (fVar16 - (fVar46 + fVar46)) +
                                 (fVar21 * fVar27 +
                                 fVar33 * fVar41 + fVar45 * fVar26 + fVar47 * fVar37) *
                                 (fVar46 - (fVar16 + fVar16))) * fVar22) & uVar11);
      ddPdudu[3] = (float)(~uVar12 & (uint)ddPdudu[3] |
                          (uint)(((fVar19 * fVar34 +
                                  fVar30 * fVar43 + fVar31 * fVar28 + fVar32 * fVar38) * fVar17 +
                                 (fVar29 * fVar34 +
                                 fVar52 * fVar43 + fVar53 * fVar28 + fVar1 * fVar38) * fVar48 +
                                 (fVar25 * fVar34 +
                                 fVar49 * fVar43 + fVar50 * fVar28 + fVar51 * fVar38) *
                                 (fVar17 - (fVar48 + fVar48)) +
                                 (fVar21 * fVar34 +
                                 fVar33 * fVar43 + fVar45 * fVar28 + fVar47 * fVar38) *
                                 (fVar48 - (fVar17 + fVar17))) * fVar22) & uVar12);
      ddPdudu = ddPdudu + dstride;
    }
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar24 = 1.0 - fVar42;
    fVar26 = 1.0 - fVar44;
    fVar28 = 1.0 - fVar46;
    fVar14 = 1.0 - fVar48;
    fVar25 = fVar24 * fVar24 * fVar24;
    fVar27 = fVar26 * fVar26 * fVar26;
    fVar29 = fVar28 * fVar28 * fVar28;
    fVar30 = fVar14 * fVar14 * fVar14;
    fVar31 = fVar42 * fVar42 * fVar42;
    fVar32 = fVar44 * fVar44 * fVar44;
    fVar33 = fVar46 * fVar46 * fVar46;
    fVar34 = fVar48 * fVar48 * fVar48;
    fVar19 = fVar24 * fVar42 * fVar24;
    fVar20 = fVar26 * fVar44 * fVar26;
    fVar21 = fVar28 * fVar46 * fVar28;
    fVar23 = fVar14 * fVar48 * fVar14;
    fVar42 = fVar42 * fVar24 * fVar42;
    fVar44 = fVar44 * fVar26 * fVar44;
    fVar46 = fVar46 * fVar28 * fVar46;
    fVar48 = fVar48 * fVar14 * fVar48;
    fVar24 = (vv->field_0).v[0];
    fVar26 = (vv->field_0).v[1];
    fVar28 = (vv->field_0).v[2];
    fVar14 = (vv->field_0).v[3];
    fVar15 = 1.0 - fVar24;
    fVar16 = 1.0 - fVar26;
    fVar17 = 1.0 - fVar28;
    fVar18 = 1.0 - fVar14;
    fVar35 = fVar24 - (fVar15 + fVar15);
    fVar36 = fVar26 - (fVar16 + fVar16);
    fVar37 = fVar28 - (fVar17 + fVar17);
    fVar38 = fVar14 - (fVar18 + fVar18);
    fVar39 = fVar15 - (fVar24 + fVar24);
    fVar40 = fVar16 - (fVar26 + fVar26);
    fVar41 = fVar17 - (fVar28 + fVar28);
    fVar43 = fVar18 - (fVar14 + fVar14);
    for (sVar13 = 0; N != sVar13; sVar13 = sVar13 + 1) {
      fVar45 = *(float *)(this + sVar13 * 4);
      fVar47 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar49 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar50 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar51 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar52 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar53 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar1 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar2 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar3 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar4 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar5 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar6 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar7 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar8 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar9 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *ddPdvdv = (float)(~(valid->field_0).i[0] & (uint)*ddPdvdv |
                        (uint)(((fVar50 * fVar15 + fVar7 * fVar35 + fVar8 * fVar39 + fVar9 * fVar24)
                                * fVar31 * 0.16666667 +
                                (fVar49 * fVar15 + fVar4 * fVar35 + fVar5 * fVar39 + fVar6 * fVar24)
                                * (fVar19 * 6.0 + fVar42 * 12.0 + fVar31 * 4.0 + fVar25) *
                                  0.16666667 +
                                (fVar47 * fVar15 + fVar1 * fVar35 + fVar2 * fVar39 + fVar3 * fVar24)
                                * (fVar42 * 6.0 + fVar19 * 12.0 + fVar25 * 4.0 + fVar31) *
                                  0.16666667 +
                               (fVar45 * fVar15 +
                               fVar51 * fVar35 + fVar52 * fVar39 + fVar53 * fVar24) *
                               fVar25 * 0.16666667) * fVar22) & (valid->field_0).i[0]);
      ddPdvdv[1] = (float)(~uVar10 & (uint)ddPdvdv[1] |
                          (uint)(((fVar50 * fVar16 +
                                  fVar7 * fVar36 + fVar8 * fVar40 + fVar9 * fVar26) *
                                  fVar32 * 0.16666667 +
                                  (fVar49 * fVar16 +
                                  fVar4 * fVar36 + fVar5 * fVar40 + fVar6 * fVar26) *
                                  (fVar20 * 6.0 + fVar44 * 12.0 + fVar32 * 4.0 + fVar27) *
                                  0.16666667 +
                                  (fVar47 * fVar16 +
                                  fVar1 * fVar36 + fVar2 * fVar40 + fVar3 * fVar26) *
                                  (fVar44 * 6.0 + fVar20 * 12.0 + fVar27 * 4.0 + fVar32) *
                                  0.16666667 +
                                 (fVar45 * fVar16 +
                                 fVar51 * fVar36 + fVar52 * fVar40 + fVar53 * fVar26) *
                                 fVar27 * 0.16666667) * fVar22) & uVar10);
      ddPdvdv[2] = (float)(~uVar11 & (uint)ddPdvdv[2] |
                          (uint)(((fVar50 * fVar17 +
                                  fVar7 * fVar37 + fVar8 * fVar41 + fVar9 * fVar28) *
                                  fVar33 * 0.16666667 +
                                  (fVar49 * fVar17 +
                                  fVar4 * fVar37 + fVar5 * fVar41 + fVar6 * fVar28) *
                                  (fVar21 * 6.0 + fVar46 * 12.0 + fVar33 * 4.0 + fVar29) *
                                  0.16666667 +
                                  (fVar47 * fVar17 +
                                  fVar1 * fVar37 + fVar2 * fVar41 + fVar3 * fVar28) *
                                  (fVar46 * 6.0 + fVar21 * 12.0 + fVar29 * 4.0 + fVar33) *
                                  0.16666667 +
                                 (fVar45 * fVar17 +
                                 fVar51 * fVar37 + fVar52 * fVar41 + fVar53 * fVar28) *
                                 fVar29 * 0.16666667) * fVar22) & uVar11);
      ddPdvdv[3] = (float)(~uVar12 & (uint)ddPdvdv[3] |
                          (uint)(((fVar50 * fVar18 +
                                  fVar7 * fVar38 + fVar8 * fVar43 + fVar9 * fVar14) *
                                  fVar34 * 0.16666667 +
                                  (fVar49 * fVar18 +
                                  fVar4 * fVar38 + fVar5 * fVar43 + fVar6 * fVar14) *
                                  (fVar23 * 6.0 + fVar48 * 12.0 + fVar34 * 4.0 + fVar30) *
                                  0.16666667 +
                                  (fVar47 * fVar18 +
                                  fVar1 * fVar38 + fVar2 * fVar43 + fVar3 * fVar14) *
                                  (fVar48 * 6.0 + fVar23 * 12.0 + fVar30 * 4.0 + fVar34) *
                                  0.16666667 +
                                 (fVar45 * fVar18 +
                                 fVar51 * fVar38 + fVar52 * fVar43 + fVar53 * fVar14) *
                                 fVar30 * 0.16666667) * fVar22) & uVar12);
      ddPdvdv = ddPdvdv + dstride;
    }
    fVar42 = (uu->field_0).v[0];
    fVar44 = (uu->field_0).v[1];
    fVar46 = (uu->field_0).v[2];
    fVar48 = (uu->field_0).v[3];
    fVar31 = 1.0 - fVar42;
    fVar32 = 1.0 - fVar44;
    fVar33 = 1.0 - fVar46;
    fVar34 = 1.0 - fVar48;
    fVar15 = fVar42 * fVar31 * 4.0;
    fVar17 = fVar44 * fVar32 * 4.0;
    fVar19 = fVar46 * fVar33 * 4.0;
    fVar21 = fVar48 * fVar34 * 4.0;
    fVar24 = (vv->field_0).v[0];
    fVar26 = (vv->field_0).v[1];
    fVar28 = (vv->field_0).v[2];
    fVar14 = (vv->field_0).v[3];
    fVar25 = 1.0 - fVar24;
    fVar27 = 1.0 - fVar26;
    fVar29 = 1.0 - fVar28;
    fVar30 = 1.0 - fVar14;
    fVar16 = fVar24 * fVar25 * 4.0;
    fVar18 = fVar26 * fVar27 * 4.0;
    fVar20 = fVar28 * fVar29 * 4.0;
    fVar23 = fVar14 * fVar30 * 4.0;
    fVar39 = -fVar25 * fVar25 * 0.5;
    fVar40 = -fVar27 * fVar27 * 0.5;
    fVar41 = -fVar29 * fVar29 * 0.5;
    fVar43 = -fVar30 * fVar30 * 0.5;
    fVar35 = (-fVar24 * fVar24 - fVar16) * 0.5;
    fVar36 = (-fVar26 * fVar26 - fVar18) * 0.5;
    fVar37 = (-fVar28 * fVar28 - fVar20) * 0.5;
    fVar38 = (-fVar14 * fVar14 - fVar23) * 0.5;
    fVar16 = (fVar25 * fVar25 + fVar16) * 0.5;
    fVar18 = (fVar27 * fVar27 + fVar18) * 0.5;
    fVar20 = (fVar29 * fVar29 + fVar20) * 0.5;
    fVar23 = (fVar30 * fVar30 + fVar23) * 0.5;
    fVar24 = fVar24 * fVar24 * 0.5;
    fVar26 = fVar26 * fVar26 * 0.5;
    fVar28 = fVar28 * fVar28 * 0.5;
    fVar14 = fVar14 * fVar14 * 0.5;
    for (sVar13 = 0; N != sVar13; sVar13 = sVar13 + 1) {
      fVar25 = *(float *)(this + sVar13 * 4);
      fVar27 = *(float *)(this + sVar13 * 4 + 0x10);
      fVar29 = *(float *)(this + sVar13 * 4 + 0x20);
      fVar30 = *(float *)(this + sVar13 * 4 + 0x30);
      fVar45 = *(float *)(this + sVar13 * 4 + 0x40);
      fVar47 = *(float *)(this + sVar13 * 4 + 0x80);
      fVar49 = *(float *)(this + sVar13 * 4 + 0xc0);
      fVar50 = *(float *)(this + sVar13 * 4 + 0x50);
      fVar51 = *(float *)(this + sVar13 * 4 + 0x90);
      fVar52 = *(float *)(this + sVar13 * 4 + 0xd0);
      fVar53 = *(float *)(this + sVar13 * 4 + 0x60);
      fVar1 = *(float *)(this + sVar13 * 4 + 0xa0);
      fVar2 = *(float *)(this + sVar13 * 4 + 0xe0);
      fVar3 = *(float *)(this + sVar13 * 4 + 0x70);
      fVar4 = *(float *)(this + sVar13 * 4 + 0xb0);
      fVar5 = *(float *)(this + sVar13 * 4 + 0xf0);
      uVar10 = (valid->field_0).i[1];
      uVar11 = (valid->field_0).i[2];
      uVar12 = (valid->field_0).i[3];
      *ddPdudv = (float)(~(valid->field_0).i[0] & (uint)*ddPdudv |
                        (uint)(((fVar30 * fVar39 + fVar3 * fVar35 + fVar4 * fVar16 + fVar5 * fVar24)
                                * fVar42 * fVar42 * 0.5 +
                                (fVar29 * fVar39 + fVar53 * fVar35 + fVar1 * fVar16 + fVar2 * fVar24
                                ) * (fVar31 * fVar31 + fVar15) * 0.5 +
                                (fVar27 * fVar39 +
                                fVar50 * fVar35 + fVar51 * fVar16 + fVar52 * fVar24) *
                                (-fVar42 * fVar42 - fVar15) * 0.5 +
                               (fVar25 * fVar39 +
                               fVar45 * fVar35 + fVar47 * fVar16 + fVar49 * fVar24) *
                               -fVar31 * fVar31 * 0.5) * fVar22) & (valid->field_0).i[0]);
      ddPdudv[1] = (float)(~uVar10 & (uint)ddPdudv[1] |
                          (uint)(((fVar30 * fVar40 +
                                  fVar3 * fVar36 + fVar4 * fVar18 + fVar5 * fVar26) *
                                  fVar44 * fVar44 * 0.5 +
                                  (fVar29 * fVar40 +
                                  fVar53 * fVar36 + fVar1 * fVar18 + fVar2 * fVar26) *
                                  (fVar32 * fVar32 + fVar17) * 0.5 +
                                  (fVar27 * fVar40 +
                                  fVar50 * fVar36 + fVar51 * fVar18 + fVar52 * fVar26) *
                                  (-fVar44 * fVar44 - fVar17) * 0.5 +
                                 (fVar25 * fVar40 +
                                 fVar45 * fVar36 + fVar47 * fVar18 + fVar49 * fVar26) *
                                 -fVar32 * fVar32 * 0.5) * fVar22) & uVar10);
      ddPdudv[2] = (float)(~uVar11 & (uint)ddPdudv[2] |
                          (uint)(((fVar30 * fVar41 +
                                  fVar3 * fVar37 + fVar4 * fVar20 + fVar5 * fVar28) *
                                  fVar46 * fVar46 * 0.5 +
                                  (fVar29 * fVar41 +
                                  fVar53 * fVar37 + fVar1 * fVar20 + fVar2 * fVar28) *
                                  (fVar33 * fVar33 + fVar19) * 0.5 +
                                  (fVar27 * fVar41 +
                                  fVar50 * fVar37 + fVar51 * fVar20 + fVar52 * fVar28) *
                                  (-fVar46 * fVar46 - fVar19) * 0.5 +
                                 (fVar25 * fVar41 +
                                 fVar45 * fVar37 + fVar47 * fVar20 + fVar49 * fVar28) *
                                 -fVar33 * fVar33 * 0.5) * fVar22) & uVar11);
      ddPdudv[3] = (float)(~uVar12 & (uint)ddPdudv[3] |
                          (uint)(((fVar30 * fVar43 +
                                  fVar3 * fVar38 + fVar4 * fVar23 + fVar5 * fVar14) *
                                  fVar48 * fVar48 * 0.5 +
                                  (fVar29 * fVar43 +
                                  fVar53 * fVar38 + fVar1 * fVar23 + fVar2 * fVar14) *
                                  (fVar34 * fVar34 + fVar21) * 0.5 +
                                  (fVar27 * fVar43 +
                                  fVar50 * fVar38 + fVar51 * fVar23 + fVar52 * fVar14) *
                                  (-fVar48 * fVar48 - fVar21) * 0.5 +
                                 (fVar25 * fVar43 +
                                 fVar45 * fVar38 + fVar47 * fVar23 + fVar49 * fVar14) *
                                 -fVar34 * fVar34 * 0.5) * fVar22) & uVar12);
      ddPdudv = ddPdudv + dstride;
    }
  }
  return;
}

Assistant:

void eval(const vbool& valid, const vfloat& uu, const vfloat& vv, 
                float* P, float* dPdu, float* dPdv, float* ddPdudu, float* ddPdvdv, float* ddPdudv, 
                const float dscale, const size_t dstride, const size_t N) const
      {
        if (P) {
          const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
          const Vec4<vfloat> v_n = BSplineBasis::eval(vv); 
          for (size_t i=0; i<N; i++) vfloat::store(valid,P+i*dstride,eval(i,uu,vv,u_n,v_n));
        }
        if (dPdu) 
        {
          {
            assert(dPdu);
            const Vec4<vfloat> u_n = BSplineBasis::derivative(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::eval(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,dPdu+i*dstride,eval(i,uu,vv,u_n,v_n)*dscale);
          }
          {
            assert(dPdv);
            const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,dPdv+i*dstride,eval(i,uu,vv,u_n,v_n)*dscale);
          }
        }
        if (ddPdudu) 
        {
          {
            assert(ddPdudu);
            const Vec4<vfloat> u_n = BSplineBasis::derivative2(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::eval(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdudu+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
          {
            assert(ddPdvdv);
            const Vec4<vfloat> u_n = BSplineBasis::eval(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative2(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdvdv+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
          {
            assert(ddPdudv);
            const Vec4<vfloat> u_n = BSplineBasis::derivative(uu); 
            const Vec4<vfloat> v_n = BSplineBasis::derivative(vv);
            for (size_t i=0; i<N; i++) vfloat::store(valid,ddPdudv+i*dstride,eval(i,uu,vv,u_n,v_n)*sqr(dscale));
          }
        }
      }